

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

bool anon_unknown.dwarf_a67e::StrEqVerbose(string *a,string *b,string *text)

{
  undefined8 uVar1;
  bool bVar2;
  string *text_local;
  string *b_local;
  string *a_local;
  
  bVar2 = std::operator!=(a,b);
  if (bVar2) {
    uVar1 = std::__cxx11::string::c_str();
    printf("EXPECTED: %s\n",uVar1);
    uVar1 = std::__cxx11::string::c_str();
    printf("ACTUAL: %s\n",uVar1);
    uVar1 = std::__cxx11::string::c_str();
    printf("TEXT: %s\n",uVar1);
  }
  a_local._7_1_ = !bVar2;
  return a_local._7_1_;
}

Assistant:

bool StrEqVerbose(const string& a, const string& b,
                         const string& text) {
  if (a != b) {
    printf("EXPECTED: %s\n", a.c_str());
    printf("ACTUAL: %s\n", b.c_str());
    printf("TEXT: %s\n", text.c_str());
    return false;
  }
  return true;
}